

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cloud.c
# Opt level: O3

void Cloud_bddPrint(CloudManager *dd,CloudNode *Func)

{
  bool bVar1;
  CloudNode *bCube;
  char *__format;
  
  if (dd->zero == Func) {
    __format = "Constant 0.";
  }
  else {
    if (dd->one != Func) {
      bCube = Cloud_GetOneCube(dd,Func);
      if (bCube != (CloudNode *)0x0) {
        bVar1 = false;
        do {
          if (bCube == dd->zero) break;
          if (bVar1) {
            printf(" + ");
          }
          Cloud_bddPrintCube(dd,bCube);
          Func = Cloud_bddAnd(dd,Func,(CloudNode *)((ulong)bCube ^ 1));
          bCube = Cloud_GetOneCube(dd,Func);
          bVar1 = true;
        } while (bCube != (CloudNode *)0x0);
      }
      goto LAB_005d0e98;
    }
    __format = "Constant 1.";
  }
  printf(__format);
LAB_005d0e98:
  putchar(10);
  return;
}

Assistant:

void Cloud_bddPrint( CloudManager * dd, CloudNode * Func )
{
    CloudNode * Cube;
    int fFirst = 1;

    if ( Func == dd->zero )
        printf( "Constant 0." );
    else if ( Func == dd->one )
        printf( "Constant 1." );
    else
    {
        while ( 1 )
        {
            Cube = Cloud_GetOneCube( dd, Func );
            if ( Cube == NULL || Cube == dd->zero )
                break;
            if ( fFirst )       fFirst = 0;
            else                printf( " + " );
            Cloud_bddPrintCube( dd, Cube );
            Func = Cloud_bddAnd( dd, Func, Cloud_Not(Cube) );
        } 
    }
    printf( "\n" );
}